

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roialign.cpp
# Opt level: O1

int __thiscall
ncnn::ROIAlign::forward
          (ROIAlign *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  ulong uVar1;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  uint _c;
  uint uVar5;
  pointer pMVar6;
  Mat *this_00;
  void *pvVar7;
  size_t sVar8;
  size_t sVar9;
  void *pvVar10;
  size_t sVar11;
  size_t sVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  long lVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  bool bVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar42;
  float fVar43;
  float fVar44;
  undefined1 auVar41 [16];
  ulong local_130;
  void *local_128;
  void *local_118;
  ulong local_d8;
  
  pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar3 = pMVar6->w;
  iVar4 = pMVar6->h;
  _c = pMVar6->c;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create(this_00,this->pooled_width,this->pooled_height,_c,pMVar6->elemsize,opt->blob_allocator
             );
  iVar19 = -100;
  if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
    fVar44 = this->spatial_scale;
    auVar41._0_8_ = *pMVar6[1].data;
    uVar2 = *(undefined8 *)((long)pMVar6[1].data + 8);
    fVar30 = (float)auVar41._0_8_ * fVar44;
    fVar33 = (float)((ulong)auVar41._0_8_ >> 0x20) * fVar44;
    fVar34 = fVar44 * 0.0;
    fVar35 = fVar44 * 0.0;
    fVar40 = (float)uVar2 * fVar44;
    fVar42 = (float)((ulong)uVar2 >> 0x20) * fVar44;
    fVar43 = fVar44 * 0.0;
    fVar44 = fVar44 * 0.0;
    bVar26 = this->aligned != false;
    if (bVar26) {
      fVar30 = fVar30 + -0.5;
      fVar33 = fVar33 + -0.5;
      fVar34 = fVar34 + 0.0;
      fVar35 = fVar35 + 0.0;
      fVar40 = fVar40 + -0.5;
      fVar42 = fVar42 + -0.5;
      fVar43 = fVar43 + 0.0;
      fVar44 = fVar44 + 0.0;
    }
    auVar41._0_8_ = CONCAT44(fVar42 - fVar33,fVar40 - fVar30);
    auVar41._8_4_ = fVar43 - fVar34;
    auVar41._12_4_ = fVar44 - fVar35;
    if (!bVar26) {
      auVar41 = maxps(auVar41,_DAT_0055b450);
    }
    fVar34 = (float)auVar41._0_8_ / (float)this->pooled_width;
    fVar44 = (float)((ulong)auVar41._0_8_ >> 0x20) / (float)this->pooled_height;
    if (this->version == 1) {
      iVar19 = this->sampling_ratio;
      if (iVar19 < 1) {
        fVar35 = ceilf(fVar44);
        fVar40 = ceilf(fVar34);
      }
      else {
        fVar35 = (float)iVar19;
        fVar40 = (float)iVar19;
      }
      if ((int)_c < 1) {
        return 0;
      }
      iVar15 = (int)fVar35;
      iVar14 = (int)fVar40;
      iVar19 = 1;
      if (1 < iVar14 * iVar15) {
        iVar19 = iVar14 * iVar15;
      }
      sVar8 = pMVar6->cstep;
      sVar9 = pMVar6->elemsize;
      sVar11 = this_00->cstep;
      sVar12 = this_00->elemsize;
      pvVar7 = pMVar6->data;
      pvVar10 = this_00->data;
      uVar5 = this->pooled_width;
      iVar24 = this->pooled_height;
      local_130 = 0;
      do {
        if (0 < iVar24) {
          lVar17 = sVar8 * sVar9 * local_130;
          local_128 = (void *)(sVar11 * sVar12 * local_130 + (long)pvVar10);
          iVar13 = 0;
          do {
            if (0 < (int)uVar5) {
              uVar16 = 0;
              do {
                if (iVar15 < 1) {
                  fVar35 = 0.0;
                }
                else {
                  fVar35 = 0.0;
                  iVar18 = 0;
                  do {
                    if (0 < iVar14) {
                      fVar40 = ((float)iVar18 + 0.5) * fVar44 * (1.0 / (float)iVar15) +
                               (float)iVar13 * fVar44 + fVar33;
                      iVar25 = 0;
                      do {
                        if ((((-1.0 <= fVar40) && (fVar40 <= (float)iVar4)) &&
                            (fVar42 = ((float)iVar25 + 0.5) * fVar34 * (1.0 / (float)iVar14) +
                                      (float)(int)uVar16 * fVar34 + fVar30, -1.0 <= fVar42)) &&
                           (fVar42 <= (float)iVar3)) {
                          fVar43 = 0.0;
                          if (fVar40 <= 0.0) {
                            fVar40 = 0.0;
                          }
                          if (fVar42 <= 0.0) {
                            fVar42 = 0.0;
                          }
                          iVar21 = (int)fVar42;
                          iVar20 = iVar21 + 1;
                          iVar22 = (int)fVar40 + 1;
                          if (iVar20 < iVar3) {
                            fVar29 = fVar42 - (float)(int)fVar42;
                            if (iVar20 < iVar3) goto LAB_004afaec;
LAB_004afb10:
                            fVar42 = 1.0;
                          }
                          else {
                            fVar29 = 0.0;
                            if (iVar3 <= iVar20) goto LAB_004afb10;
LAB_004afaec:
                            fVar42 = (float)iVar20 - fVar42;
                          }
                          if (iVar3 <= iVar20) {
                            iVar20 = iVar3 + -1;
                          }
                          if (iVar22 < iVar4) {
                            fVar27 = (float)iVar22 - fVar40;
                            fVar43 = fVar40 - (float)(int)fVar40;
                          }
                          else {
                            fVar27 = 1.0;
                            iVar22 = iVar4 + -1;
                          }
                          iVar23 = (int)fVar40 * iVar3;
                          fVar35 = (*(float *)((long)pvVar7 + (long)(iVar23 + iVar20) * 4 + lVar17)
                                    * fVar29 +
                                   *(float *)((long)pvVar7 + (long)(iVar23 + iVar21) * 4 + lVar17) *
                                   fVar42) * fVar27 + fVar35 +
                                   (fVar29 * *(float *)((long)pvVar7 +
                                                       (long)(iVar22 * iVar3 + iVar20) * 4 + lVar17)
                                   + fVar42 * *(float *)((long)pvVar7 +
                                                        (long)(iVar21 + iVar22 * iVar3) * 4 + lVar17
                                                        )) * fVar43;
                        }
                        iVar25 = iVar25 + 1;
                      } while (iVar14 != iVar25);
                    }
                    iVar18 = iVar18 + 1;
                  } while (iVar18 != iVar15);
                }
                *(float *)((long)local_128 + uVar16 * 4) = fVar35 * (1.0 / (float)iVar19);
                uVar16 = uVar16 + 1;
              } while (uVar16 != uVar5);
            }
            local_128 = (void *)((long)local_128 + (long)(int)uVar5 * 4);
            iVar13 = iVar13 + 1;
          } while (iVar13 != iVar24);
        }
        local_130 = local_130 + 1;
      } while (local_130 != _c);
    }
    else {
      if (this->version != 0) {
        return 0;
      }
      if ((int)_c < 1) {
        return 0;
      }
      pvVar7 = pMVar6->data;
      sVar8 = pMVar6->cstep;
      sVar9 = pMVar6->elemsize;
      pvVar10 = this_00->data;
      sVar11 = this_00->cstep;
      sVar12 = this_00->elemsize;
      uVar5 = this->pooled_width;
      iVar19 = this->pooled_height;
      fVar35 = (float)iVar4;
      fVar40 = (float)iVar3;
      local_d8 = 0;
      do {
        if (0 < iVar19) {
          lVar17 = sVar8 * sVar9 * local_d8;
          local_118 = (void *)(sVar11 * sVar12 * local_d8 + (long)pvVar10);
          iVar15 = this->sampling_ratio;
          iVar14 = 0;
          do {
            if (0 < (int)uVar5) {
              fVar42 = (float)iVar14 * fVar44 + fVar33;
              fVar43 = (float)(iVar14 + 1) * fVar44 + fVar33;
              if (fVar42 <= 0.0) {
                fVar42 = 0.0;
              }
              if (fVar35 <= fVar42) {
                fVar42 = fVar35;
              }
              if (fVar43 <= 0.0) {
                fVar43 = 0.0;
              }
              if (fVar35 <= fVar43) {
                fVar43 = fVar35;
              }
              fVar27 = ceilf(fVar43 - fVar42);
              fVar29 = (float)iVar15;
              if (iVar15 < 1) {
                fVar29 = fVar27;
              }
              iVar24 = (int)fVar29;
              uVar16 = 0;
              do {
                uVar1 = uVar16 + 1;
                fVar39 = (float)(int)uVar16 * fVar34 + fVar30;
                fVar27 = (float)(int)uVar1 * fVar34 + fVar30;
                if (fVar39 <= 0.0) {
                  fVar39 = 0.0;
                }
                if (fVar40 <= fVar39) {
                  fVar39 = fVar40;
                }
                if (fVar27 <= 0.0) {
                  fVar27 = 0.0;
                }
                if (fVar40 <= fVar27) {
                  fVar27 = fVar40;
                }
                fVar28 = (float)iVar15;
                if (iVar15 < 1) {
                  fVar28 = ceilf(fVar27 - fVar39);
                }
                iVar13 = (int)fVar28;
                fVar28 = 0.0;
                fVar37 = 0.0;
                if (0 < iVar24) {
                  fVar37 = 0.0;
                  iVar18 = 0;
                  do {
                    if (0 < iVar13) {
                      fVar31 = ((float)iVar18 + 0.5) * fVar44 * (1.0 / (float)(int)fVar29) + fVar42;
                      iVar25 = (int)fVar31 + 1;
                      if (iVar25 < iVar4) {
                        fVar36 = (float)iVar25 - fVar31;
                        if (iVar25 < iVar4) goto LAB_004af6ed;
LAB_004af710:
                        fVar32 = 0.0;
                      }
                      else {
                        fVar36 = 1.0;
                        if (iVar4 <= iVar25) goto LAB_004af710;
LAB_004af6ed:
                        fVar32 = fVar31 - (float)(int)fVar31;
                      }
                      if (iVar4 <= iVar25) {
                        iVar25 = iVar4 + -1;
                      }
                      iVar20 = (int)fVar31 * iVar3;
                      iVar22 = 0;
                      do {
                        fVar31 = ((float)iVar22 + 0.5) * fVar34 * (1.0 / (float)iVar13) + fVar39;
                        iVar23 = (int)fVar31;
                        iVar21 = iVar23 + 1;
                        if (iVar21 < iVar3) {
                          fVar38 = fVar31 - (float)(int)fVar31;
                          if (iVar3 <= iVar21) goto LAB_004af74f;
LAB_004af765:
                          fVar31 = (float)iVar21 - fVar31;
                        }
                        else {
                          fVar38 = 0.0;
                          if (iVar21 < iVar3) goto LAB_004af765;
LAB_004af74f:
                          fVar31 = 1.0;
                        }
                        if (iVar3 <= iVar21) {
                          iVar21 = iVar3 + -1;
                        }
                        fVar37 = (fVar38 * *(float *)((long)pvVar7 +
                                                     (long)(iVar21 + iVar25 * iVar3) * 4 + lVar17) +
                                 fVar31 * *(float *)((long)pvVar7 +
                                                    (long)(iVar23 + iVar25 * iVar3) * 4 + lVar17)) *
                                 fVar32 + fVar37 + (*(float *)((long)pvVar7 +
                                                              (long)(iVar21 + iVar20) * 4 + lVar17)
                                                    * fVar38 +
                                                   *(float *)((long)pvVar7 +
                                                             (long)(iVar20 + iVar23) * 4 + lVar17) *
                                                   fVar31) * fVar36;
                        iVar22 = iVar22 + 1;
                      } while (iVar13 != iVar22);
                    }
                    iVar18 = iVar18 + 1;
                  } while (iVar18 != iVar24);
                }
                if (fVar42 < fVar43 && fVar39 < fVar27) {
                  fVar28 = fVar37 / (float)(iVar13 * iVar24);
                }
                *(float *)((long)local_118 + uVar16 * 4) = fVar28;
                uVar16 = uVar1;
              } while (uVar1 != uVar5);
            }
            local_118 = (void *)((long)local_118 + (long)(int)uVar5 * 4);
            iVar14 = iVar14 + 1;
          } while (iVar14 != iVar19);
        }
        local_d8 = local_d8 + 1;
      } while (local_d8 != _c);
    }
    iVar19 = 0;
  }
  return iVar19;
}

Assistant:

int ROIAlign::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;
    int channels = bottom_blob.c;

    const Mat& roi_blob = bottom_blobs[1];

    Mat& top_blob = top_blobs[0];
    top_blob.create(pooled_width, pooled_height, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // For each ROI R = [x y w h]: avg pool over R
    const float* roi_ptr = roi_blob;

    float roi_x1 = roi_ptr[0] * spatial_scale;
    float roi_y1 = roi_ptr[1] * spatial_scale;
    float roi_x2 = roi_ptr[2] * spatial_scale;
    float roi_y2 = roi_ptr[3] * spatial_scale;
    if (aligned)
    {
        roi_x1 -= 0.5f;
        roi_y1 -= 0.5f;
        roi_x2 -= 0.5f;
        roi_y2 -= 0.5f;
    }

    float roi_w = roi_x2 - roi_x1;
    float roi_h = roi_y2 - roi_y1;

    if (!aligned)
    {
        roi_w = std::max(roi_w, 1.f);
        roi_h = std::max(roi_h, 1.f);
    }

    float bin_size_w = roi_w / (float)pooled_width;
    float bin_size_h = roi_h / (float)pooled_height;

    if (version == 0)
    {
        // original version
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int ph = 0; ph < pooled_height; ph++)
            {
                for (int pw = 0; pw < pooled_width; pw++)
                {
                    // Compute pooling region for this output unit:
                    //  start (included) = ph * roi_height / pooled_height
                    //  end (excluded) = (ph + 1) * roi_height / pooled_height
                    float hstart = roi_y1 + ph * bin_size_h;
                    float wstart = roi_x1 + pw * bin_size_w;
                    float hend = roi_y1 + (ph + 1) * bin_size_h;
                    float wend = roi_x1 + (pw + 1) * bin_size_w;

                    hstart = std::min(std::max(hstart, 0.f), (float)h);
                    wstart = std::min(std::max(wstart, 0.f), (float)w);
                    hend = std::min(std::max(hend, 0.f), (float)h);
                    wend = std::min(std::max(wend, 0.f), (float)w);

                    int bin_grid_h = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(hend - hstart));
                    int bin_grid_w = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(wend - wstart));

                    bool is_empty = (hend <= hstart) || (wend <= wstart);
                    int area = bin_grid_h * bin_grid_w;

                    float sum = 0.f;
                    for (int by = 0; by < bin_grid_h; by++)
                    {
                        float y = hstart + (by + 0.5f) * bin_size_h / (float)bin_grid_h;

                        for (int bx = 0; bx < bin_grid_w; bx++)
                        {
                            float x = wstart + (bx + 0.5f) * bin_size_w / (float)bin_grid_w;

                            // bilinear interpolate at (x,y)
                            float v = bilinear_interpolate(ptr, w, h, x, y);

                            sum += v;
                        }
                    }

                    outptr[pw] = is_empty ? 0.f : (sum / (float)area);
                }

                outptr += pooled_width;
            }
        }
    }
    else if (version == 1)
    {
        // the version in detectron 2
        int roi_bin_grid_h = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(roi_h / pooled_height));
        int roi_bin_grid_w = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(roi_w / pooled_width));

        const float count = (float)std::max(roi_bin_grid_h * roi_bin_grid_w, 1);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int ph = 0; ph < pooled_height; ph++)
            {
                for (int pw = 0; pw < pooled_width; pw++)
                {
                    float sum = 0.f;
                    for (int by = 0; by < roi_bin_grid_h; by++)
                    {
                        float y = roi_y1 + ph * bin_size_h + (by + 0.5f) * bin_size_h / (float)roi_bin_grid_h;

                        for (int bx = 0; bx < roi_bin_grid_w; bx++)
                        {
                            float x = roi_x1 + pw * bin_size_w + (bx + 0.5f) * bin_size_w / (float)roi_bin_grid_w;

                            if (y < -1.0 || y > h || x < -1.0 || x > w)
                            {
                                // empty
                                continue;
                            }
                            else
                            {
                                if (y <= 0) y = 0;
                                if (x <= 0) x = 0;

                                // bilinear interpolate at (x,y)
                                float v = bilinear_interpolate(ptr, w, h, x, y);
                                sum += v;
                            }
                        }
                    }
                    outptr[pw] = sum / count;
                }

                outptr += pooled_width;
            }
        }
    }

    return 0;
}